

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

size_t unicode_to_utf8(char *p,size_t remaining,uint32_t uc)

{
  byte bVar1;
  char *_p;
  uint32_t uc_local;
  size_t remaining_local;
  char *p_local;
  
  _p._4_4_ = uc;
  if (0x10ffff < uc) {
    _p._4_4_ = 0xfffd;
  }
  bVar1 = (byte)_p._4_4_;
  if (_p._4_4_ < 0x80) {
    if (remaining == 0) {
      return 0;
    }
    remaining_local = (size_t)(p + 1);
    *p = bVar1;
  }
  else if (_p._4_4_ < 0x800) {
    if (remaining < 2) {
      return 0;
    }
    *p = (byte)(_p._4_4_ >> 6) & 0x1f | 0xc0;
    remaining_local = (size_t)(p + 2);
    p[1] = bVar1 & 0x3f | 0x80;
  }
  else if (_p._4_4_ < 0x10000) {
    if (remaining < 3) {
      return 0;
    }
    *p = (byte)(_p._4_4_ >> 0xc) & 0xf | 0xe0;
    p[1] = (byte)(_p._4_4_ >> 6) & 0x3f | 0x80;
    remaining_local = (size_t)(p + 3);
    p[2] = bVar1 & 0x3f | 0x80;
  }
  else {
    if (remaining < 4) {
      return 0;
    }
    *p = (byte)(_p._4_4_ >> 0x12) & 7 | 0xf0;
    p[1] = (byte)(_p._4_4_ >> 0xc) & 0x3f | 0x80;
    p[2] = (byte)(_p._4_4_ >> 6) & 0x3f | 0x80;
    remaining_local = (size_t)(p + 4);
    p[3] = bVar1 & 0x3f | 0x80;
  }
  return remaining_local - (long)p;
}

Assistant:

static size_t
unicode_to_utf8(char *p, size_t remaining, uint32_t uc)
{
	char *_p = p;

	/* Invalid Unicode char maps to Replacement character */
	if (uc > UNICODE_MAX)
		uc = UNICODE_R_CHAR;
	/* Translate code point to UTF8 */
	if (uc <= 0x7f) {
		if (remaining == 0)
			return (0);
		*p++ = (char)uc;
	} else if (uc <= 0x7ff) {
		if (remaining < 2)
			return (0);
		*p++ = 0xc0 | ((uc >> 6) & 0x1f);
		*p++ = 0x80 | (uc & 0x3f);
	} else if (uc <= 0xffff) {
		if (remaining < 3)
			return (0);
		*p++ = 0xe0 | ((uc >> 12) & 0x0f);
		*p++ = 0x80 | ((uc >> 6) & 0x3f);
		*p++ = 0x80 | (uc & 0x3f);
	} else {
		if (remaining < 4)
			return (0);
		*p++ = 0xf0 | ((uc >> 18) & 0x07);
		*p++ = 0x80 | ((uc >> 12) & 0x3f);
		*p++ = 0x80 | ((uc >> 6) & 0x3f);
		*p++ = 0x80 | (uc & 0x3f);
	}
	return (p - _p);
}